

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int LoadEXRFromMemory(float *out_rgba,uchar *memory,char **err)

{
  int iVar1;
  undefined8 *in_RDX;
  long in_RSI;
  long in_RDI;
  int i;
  int c;
  int idxA;
  int idxB;
  int idxG;
  int idxR;
  int ret;
  EXRImage exrImage;
  int local_10a4;
  int local_10a0;
  int local_109c;
  int local_1098;
  int local_1094;
  int local_1090;
  char **in_stack_fffffffffffff3f8;
  uchar *in_stack_fffffffffffff400;
  EXRImage *in_stack_fffffffffffff408;
  int local_84;
  char **local_80;
  uchar **local_78;
  int local_60;
  int local_5c;
  int local_4;
  
  if ((in_RDI == 0) || (in_RSI == 0)) {
    if (in_RDX != (undefined8 *)0x0) {
      *in_RDX = "Invalid argument.\n";
    }
    local_4 = -1;
  }
  else {
    InitEXRImage((EXRImage *)&stack0xffffffffffffef78);
    local_4 = LoadMultiChannelEXRFromMemory
                        (in_stack_fffffffffffff408,in_stack_fffffffffffff400,
                         in_stack_fffffffffffff3f8);
    if (local_4 == 0) {
      local_1090 = -1;
      local_1094 = -1;
      local_1098 = -1;
      local_109c = -1;
      for (local_10a0 = 0; local_10a0 < local_84; local_10a0 = local_10a0 + 1) {
        iVar1 = strcmp(local_80[local_10a0],"R");
        if (iVar1 == 0) {
          local_1090 = local_10a0;
        }
        else {
          iVar1 = strcmp(local_80[local_10a0],"G");
          if (iVar1 == 0) {
            local_1094 = local_10a0;
          }
          else {
            iVar1 = strcmp(local_80[local_10a0],"B");
            if (iVar1 == 0) {
              local_1098 = local_10a0;
            }
            else {
              iVar1 = strcmp(local_80[local_10a0],"A");
              if (iVar1 == 0) {
                local_109c = local_10a0;
              }
            }
          }
        }
      }
      if (local_1090 == -1) {
        if (in_RDX != (undefined8 *)0x0) {
          *in_RDX = "R channel not found\n";
        }
        local_4 = -1;
      }
      else if (local_1094 == -1) {
        if (in_RDX != (undefined8 *)0x0) {
          *in_RDX = "G channel not found\n";
        }
        local_4 = -1;
      }
      else if (local_1098 == -1) {
        if (in_RDX != (undefined8 *)0x0) {
          *in_RDX = "B channel not found\n";
        }
        local_4 = -1;
      }
      else {
        for (local_10a4 = 0; local_10a4 < local_60 * local_5c; local_10a4 = local_10a4 + 1) {
          *(undefined4 *)(in_RDI + (long)(local_10a4 << 2) * 4) =
               *(undefined4 *)(local_78[local_1090] + (long)local_10a4 * 4);
          *(undefined4 *)(in_RDI + (long)(local_10a4 * 4 + 1) * 4) =
               *(undefined4 *)(local_78[local_1094] + (long)local_10a4 * 4);
          *(undefined4 *)(in_RDI + (long)(local_10a4 * 4 + 2) * 4) =
               *(undefined4 *)(local_78[local_1098] + (long)local_10a4 * 4);
          if (local_109c < 1) {
            *(undefined4 *)(in_RDI + (long)(local_10a4 * 4 + 3) * 4) = 0x3f800000;
          }
          else {
            *(undefined4 *)(in_RDI + (long)(local_10a4 * 4 + 3) * 4) =
                 *(undefined4 *)(local_78[local_109c] + (long)local_10a4 * 4);
          }
        }
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int LoadEXRFromMemory(float *out_rgba, const unsigned char *memory,
                      const char **err) {

  if (out_rgba == NULL || memory == NULL) {
    if (err) {
      (*err) = "Invalid argument.\n";
    }
    return -1;
  }

  EXRImage exrImage;
  InitEXRImage(&exrImage);
  int ret = LoadMultiChannelEXRFromMemory(&exrImage, memory, err);
  if (ret != 0) {
    return ret;
  }

  // RGBA
  int idxR = -1;
  int idxG = -1;
  int idxB = -1;
  int idxA = -1;
  for (int c = 0; c < exrImage.num_channels; c++) {
    if (strcmp(exrImage.channel_names[c], "R") == 0) {
      idxR = c;
    } else if (strcmp(exrImage.channel_names[c], "G") == 0) {
      idxG = c;
    } else if (strcmp(exrImage.channel_names[c], "B") == 0) {
      idxB = c;
    } else if (strcmp(exrImage.channel_names[c], "A") == 0) {
      idxA = c;
    }
  }

  if (idxR == -1) {
    if (err) {
      (*err) = "R channel not found\n";
    }

    // @todo { free exrImage }
    return -1;
  }

  if (idxG == -1) {
    if (err) {
      (*err) = "G channel not found\n";
    }
    // @todo { free exrImage }
    return -1;
  }

  if (idxB == -1) {
    if (err) {
      (*err) = "B channel not found\n";
    }
    // @todo { free exrImage }
    return -1;
  }

  // Assume `out_rgba` have enough memory allocated.
  for (int i = 0; i < exrImage.width * exrImage.height; i++) {
    out_rgba[4 * i + 0] = reinterpret_cast<float **>(exrImage.images)[idxR][i];
    out_rgba[4 * i + 1] = reinterpret_cast<float **>(exrImage.images)[idxG][i];
    out_rgba[4 * i + 2] = reinterpret_cast<float **>(exrImage.images)[idxB][i];
    if (idxA > 0) {
      out_rgba[4 * i + 3] =
          reinterpret_cast<float **>(exrImage.images)[idxA][i];
    } else {
      out_rgba[4 * i + 3] = 1.0;
    }
  }

  return 0;
}